

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsHexUpper<unsigned_long_long>(IntDigits *this,unsigned_long_long v)

{
  char *pcVar1;
  char *local_20;
  char *p;
  unsigned_long_long v_local;
  IntDigits *this_local;
  
  local_20 = &this->field_0x3c;
  p = (char *)v;
  do {
    pcVar1 = local_20 + -1;
    local_20[-1] = "0123456789ABCDEF"[(ulong)p & 0xf];
    p = (char *)((ulong)p >> 4);
    local_20 = pcVar1;
  } while (p != (char *)0x0);
  this->start_ = pcVar1;
  this->size_ = (long)this + (0x3c - (long)pcVar1);
  return;
}

Assistant:

void PrintAsHexUpper(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    // kHexTable is only lowercase, so do it manually for uppercase.
    do {
      *--p = "0123456789ABCDEF"[static_cast<size_t>(v) & 15];
      v >>= 4;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }